

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetwindow.cpp
# Opt level: O1

void __thiscall QWidgetWindow::handleFocusInEvent(QWidgetWindow *this,QFocusEvent *e)

{
  int iVar1;
  FocusWidgets fw;
  QWidget *this_00;
  
  iVar1 = QFocusEvent::reason();
  fw = LastFocusWidget;
  if (iVar1 != 2) {
    iVar1 = QFocusEvent::reason();
    fw = FirstFocusWidget;
    this_00 = (QWidget *)0x0;
    if (iVar1 != 1) goto LAB_00322bfd;
  }
  this_00 = getFocusWidget(this,fw);
LAB_00322bfd:
  if (this_00 != (QWidget *)0x0) {
    QWidget::setFocus(this_00,OtherFocusReason);
    return;
  }
  return;
}

Assistant:

void QWidgetWindow::handleFocusInEvent(QFocusEvent *e)
{
    QWidget *focusWidget = nullptr;
    if (e->reason() == Qt::BacktabFocusReason)
        focusWidget = getFocusWidget(LastFocusWidget);
    else if (e->reason() == Qt::TabFocusReason)
        focusWidget = getFocusWidget(FirstFocusWidget);

    if (focusWidget != nullptr)
        focusWidget->setFocus();
}